

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

void ot::commissioner::CommissionerApp::MergeDataset
               (ActiveOperationalDataset *aDst,ActiveOperationalDataset *aSrc)

{
  ActiveOperationalDataset *aSrc_local;
  ActiveOperationalDataset *aDst_local;
  
  if ((aSrc->mPresentFlags & 0x8000) != 0) {
    aDst->mActiveTimestamp = aSrc->mActiveTimestamp;
    aDst->mPresentFlags = aDst->mPresentFlags | 0x8000;
  }
  if ((aSrc->mPresentFlags & 0x4000) != 0) {
    aDst->mChannel = aSrc->mChannel;
    aDst->mPresentFlags = aDst->mPresentFlags | 0x4000;
  }
  if ((aSrc->mPresentFlags & 0x2000) != 0) {
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::operator=(&aDst->mChannelMask,&aSrc->mChannelMask);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x2000;
  }
  if ((aSrc->mPresentFlags & 0x1000) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mExtendedPanId,&aSrc->mExtendedPanId);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x1000;
  }
  if ((aSrc->mPresentFlags & 0x800) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mMeshLocalPrefix,&aSrc->mMeshLocalPrefix);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x800;
  }
  if ((aSrc->mPresentFlags & 0x400) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mNetworkMasterKey,&aSrc->mNetworkMasterKey);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x400;
  }
  if ((aSrc->mPresentFlags & 0x200) != 0) {
    std::__cxx11::string::operator=((string *)&aDst->mNetworkName,(string *)&aSrc->mNetworkName);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x200;
  }
  if ((aSrc->mPresentFlags & 0x100) != 0) {
    aDst->mPanId = aSrc->mPanId;
    aDst->mPresentFlags = aDst->mPresentFlags | 0x100;
  }
  if ((aSrc->mPresentFlags & 0x80) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&aDst->mPSKc,&aSrc->mPSKc)
    ;
    aDst->mPresentFlags = aDst->mPresentFlags | 0x80;
  }
  if ((aSrc->mPresentFlags & 0x40) != 0) {
    SecurityPolicy::operator=(&aDst->mSecurityPolicy,&aSrc->mSecurityPolicy);
    aDst->mPresentFlags = aDst->mPresentFlags | 0x40;
  }
  return;
}

Assistant:

void CommissionerApp::MergeDataset(ActiveOperationalDataset &aDst, const ActiveOperationalDataset &aSrc)
{
#define SET_IF_PRESENT(name)                                          \
    if (aSrc.mPresentFlags & ActiveOperationalDataset::k##name##Bit)  \
    {                                                                 \
        aDst.m##name = aSrc.m##name;                                  \
        aDst.mPresentFlags |= ActiveOperationalDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(ActiveTimestamp);
    SET_IF_PRESENT(Channel);
    SET_IF_PRESENT(ChannelMask);
    SET_IF_PRESENT(ExtendedPanId);
    SET_IF_PRESENT(MeshLocalPrefix);
    SET_IF_PRESENT(NetworkMasterKey);
    SET_IF_PRESENT(NetworkName);
    SET_IF_PRESENT(PanId);
    SET_IF_PRESENT(PSKc);
    SET_IF_PRESENT(SecurityPolicy);

#undef SET_IF_PRESENT
}